

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::AddString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int number;
  Descriptor *pDVar3;
  bool bVar4;
  CppStringType CVar5;
  uint32_t uVar6;
  RepeatedPtrFieldBase *this_00;
  string *this_01;
  string *this_02;
  char *description;
  Metadata MVar7;
  string_view src;
  anon_union_16_2_39e9c77e_for_Rep_0 local_68;
  anon_union_16_2_39e9c77e_for_Rep_0 local_58;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar3,MVar7.descriptor,field,"AddString");
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ != pDVar3) {
    description = "Field does not match message type.";
LAB_00f62ba8:
    anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"AddString",description);
  }
  bVar2 = field->field_0x1;
  if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
    if ((bVar2 & 0x20) == 0) {
      description = "Field is singular; the method requires a repeated field.";
      goto LAB_00f62ba8;
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
      anon_unknown_6::ReportReflectionUsageTypeError(pDVar3,field,"AddString",CPPTYPE_STRING);
    }
    if ((bVar2 & 8) != 0) {
      uVar6 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      number = field->number_;
      bVar4 = FieldDescriptor::requires_utf8_validation(field);
      local_48 = (size_type *)(value->_M_dataplus)._M_p;
      paVar1 = &value->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48 == paVar1) {
        local_38 = paVar1->_M_allocated_capacity;
        uStack_30 = *(undefined8 *)((long)&value->field_2 + 8);
        local_48 = &local_38;
      }
      else {
        local_38 = paVar1->_M_allocated_capacity;
      }
      local_40 = value->_M_string_length;
      (value->_M_dataplus)._M_p = (pointer)paVar1;
      value->_M_string_length = 0;
      (value->field_2)._M_local_buf[0] = '\0';
      this_02 = protobuf::internal::ExtensionSet::AddString_abi_cxx11_
                          ((ExtensionSet *)
                           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
                           number,!bVar4 * '\x03' + '\t',field);
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_48);
      if (local_48 == &local_38) {
        return;
      }
      operator_delete(local_48,local_38 + 1);
      return;
    }
    CVar5 = FieldDescriptor::cpp_string_type(field);
    if ((CVar5 == kView) || (CVar5 == kString)) {
      VerifyFieldType<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,field);
      this_00 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
      this_01 = (string *)protobuf::internal::RepeatedPtrFieldBase::AddString(this_00);
      std::__cxx11::string::operator=(this_01,(string *)value);
      return;
    }
    if (CVar5 != kCord) {
      return;
    }
    src._M_str = (value->_M_dataplus)._M_p;
    src._M_len = value->_M_string_length;
    absl::lts_20250127::Cord::Cord((Cord *)&local_68.as_tree,src,kConstructorString);
    VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
    field = (FieldDescriptor *)MutableRawImpl(this,message,field);
    if (local_68.as_tree.rep == (CordRep *)0x0 || (local_68.data[0] & 1U) == 0) {
      local_58.as_tree.cordz_info = CONCAT71(local_68.as_tree.cordz_info._1_7_,local_68.data[0]);
      local_58.as_tree.rep = local_68.as_tree.rep;
      goto LAB_00f62b14;
    }
    LOCK();
    ((local_68.as_tree.rep)->refcount).count_.super___atomic_base<int>._M_i =
         ((local_68.as_tree.rep)->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    local_58.as_tree.rep = local_68.as_tree.rep;
    local_58.as_tree.cordz_info = 1;
    bVar4 = absl::lts_20250127::cord_internal::InlineData::is_either_profiled
                      ((InlineData *)&local_58.as_tree,(InlineData *)&local_68.as_tree);
    if (!bVar4) goto LAB_00f62b14;
  }
  else {
    AddString();
  }
  absl::lts_20250127::cord_internal::CordzInfo::MaybeTrackCordImpl
            ((InlineData *)&local_58.as_tree,(InlineData *)&local_68.as_tree,kConstructorCord);
LAB_00f62b14:
  RepeatedField<absl::lts_20250127::Cord>::Add
            ((RepeatedField<absl::lts_20250127::Cord> *)field,(Cord *)&local_58.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_58.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_68.as_tree);
  return;
}

Assistant:

void Reflection::AddString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(AddString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddString(field->number(),
                                            field->requires_utf8_validation()
                                                ? FieldDescriptor::TYPE_STRING
                                                : FieldDescriptor::TYPE_BYTES,
                                            std::move(value), field);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        AddField<absl::Cord>(message, field, absl::Cord(value));
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        AddField<std::string>(message, field)->assign(std::move(value));
        break;
    }
  }
}